

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalNinjaGenerator::cmLocalNinjaGenerator
          (cmLocalNinjaGenerator *this,cmGlobalGenerator *gg,cmLocalGenerator *parent,
          Snapshot snapshot)

{
  allocator local_4d [20];
  allocator local_39;
  cmState *local_38;
  cmLinkedTree<cmState::SnapshotDataType> *pcStack_30;
  PositionType local_28;
  cmLocalGenerator *local_20;
  cmLocalGenerator *parent_local;
  cmGlobalGenerator *gg_local;
  cmLocalNinjaGenerator *this_local;
  
  local_28 = snapshot.Position.Position;
  local_38 = snapshot.State;
  pcStack_30 = snapshot.Position.Tree;
  local_20 = parent;
  parent_local = (cmLocalGenerator *)gg;
  gg_local = (cmGlobalGenerator *)this;
  cmLocalGenerator::cmLocalGenerator(&this->super_cmLocalGenerator,gg,parent,snapshot);
  (this->super_cmLocalGenerator)._vptr_cmLocalGenerator =
       (_func_int **)&PTR__cmLocalNinjaGenerator_00af3c70;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->ConfigName,"",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->HomeRelativeOutputPath,"",local_4d);
  std::allocator<char>::~allocator((allocator<char> *)local_4d);
  std::
  map<const_cmCustomCommand_*,_std::set<cmTarget_*,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_>,_std::less<const_cmCustomCommand_*>,_std::allocator<std::pair<const_cmCustomCommand_*const,_std::set<cmTarget_*,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_>_>_>_>
  ::map(&this->CustomCommandTargets);
  std::__cxx11::string::operator=
            ((string *)&(this->super_cmLocalGenerator).TargetImplib,"$TARGET_IMPLIB");
  return;
}

Assistant:

cmLocalNinjaGenerator::cmLocalNinjaGenerator(cmGlobalGenerator* gg,
                                             cmLocalGenerator* parent,
                                             cmState::Snapshot snapshot)
  : cmLocalGenerator(gg, parent, snapshot)
  , ConfigName("")
  , HomeRelativeOutputPath("")
{
  this->TargetImplib = "$TARGET_IMPLIB";
}